

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::averageDownSolutionRHS
          (MLCellLinOp *this,int camrlev,MultiFab *crse_sol,MultiFab *crse_rhs,MultiFab *fine_sol,
          MultiFab *fine_rhs)

{
  int rr;
  int ncomp;
  
  rr = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       [camrlev];
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  average_down(fine_sol,crse_sol,0,ncomp,rr);
  average_down(fine_rhs,crse_rhs,0,ncomp,rr);
  return;
}

Assistant:

void
MLCellLinOp::averageDownSolutionRHS (int camrlev, MultiFab& crse_sol, MultiFab& crse_rhs,
                                     const MultiFab& fine_sol, const MultiFab& fine_rhs)
{
    const auto amrrr = AMRRefRatio(camrlev);
    const int ncomp = getNComp();
    amrex::average_down(fine_sol, crse_sol, 0, ncomp, amrrr);
    amrex::average_down(fine_rhs, crse_rhs, 0, ncomp, amrrr);
}